

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O1

Aig_Man_t * Cgt_ManDeriveAigForGating(Cgt_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  void **__s;
  Vec_Ptr_t *vCopy1;
  void **__s_00;
  int iVar7;
  Aig_Man_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *p1;
  uint uVar10;
  long lVar11;
  int iVar12;
  void *pvVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  
  if (p->pAig->nRegs == 0) {
    __assert_fail("Aig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtAig.c"
                  ,0x110,"Aig_Man_t *Cgt_ManDeriveAigForGating(Cgt_Man_t *)");
  }
  p_00 = Aig_ManStart(p->pAig->vObjs->nSize);
  pcVar3 = (char *)malloc(9);
  builtin_strncpy(pcVar3,"CG_miter",9);
  p_00->pName = pcVar3;
  p->pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar6 = p->pAig->vCis;
  if (0 < pVVar6->nSize) {
    lVar17 = 0;
    do {
      pvVar13 = pVVar6->pArray[lVar17];
      pAVar4 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar4;
      lVar17 = lVar17 + 1;
      pVVar6 = p->pAig->vCis;
    } while (lVar17 < pVVar6->nSize);
  }
  pAVar8 = p->pAig;
  pVVar6 = pAVar8->vObjs;
  iVar16 = pVVar6->nSize;
  if (0 < iVar16) {
    lVar17 = 0;
    do {
      pvVar13 = pVVar6->pArray[lVar17];
      if ((pvVar13 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar13 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar13 & 1) != 0) goto LAB_008e2da5;
        uVar5 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        uVar5 = *(ulong *)((long)pvVar13 + 0x10) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar13 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_And(p_00,pAVar4,pAVar9);
        *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar4;
      }
      lVar17 = lVar17 + 1;
      pAVar8 = p->pAig;
      pVVar6 = pAVar8->vObjs;
      iVar16 = pVVar6->nSize;
    } while (lVar17 < iVar16);
  }
  if (p->pPars->nOdcMax < 1) {
    pAVar8 = p->pAig;
    if (0 < pAVar8->nRegs) {
      iVar16 = 0;
      do {
        uVar2 = pAVar8->nTruePos + iVar16;
        if (((((int)uVar2 < 0) || (pAVar8->vCos->nSize <= (int)uVar2)) ||
            (uVar10 = pAVar8->nTruePis + iVar16, (int)uVar10 < 0)) ||
           (pAVar8->vCis->nSize <= (int)uVar10)) goto LAB_008e2d67;
        pvVar13 = pAVar8->vCos->pArray[uVar2];
        if (((ulong)pvVar13 & 1) != 0) goto LAB_008e2da5;
        uVar5 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_Exor(p_00,*(Aig_Obj_t **)((long)pAVar8->vCis->pArray[uVar10] + 0x28),pAVar4);
        pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
        *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar4;
        iVar16 = iVar16 + 1;
        pAVar8 = p->pAig;
      } while (iVar16 < pAVar8->nRegs);
    }
  }
  else {
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    iVar7 = iVar16;
    if (iVar16 - 1U < 7) {
      iVar7 = 8;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar7;
    if (iVar7 == 0) {
      __s = (void **)0x0;
    }
    else {
      __s = (void **)malloc((long)iVar7 << 3);
    }
    pVVar6->pArray = __s;
    pVVar6->nSize = iVar16;
    __s_00 = (void **)0x0;
    memset(__s,0,(long)iVar16 << 3);
    iVar7 = pAVar8->vObjs->nSize;
    vCopy1 = (Vec_Ptr_t *)malloc(0x10);
    iVar15 = 8;
    if (6 < iVar7 - 1U) {
      iVar15 = iVar7;
    }
    vCopy1->nSize = 0;
    vCopy1->nCap = iVar15;
    if (iVar15 != 0) {
      __s_00 = (void **)malloc((long)iVar15 << 3);
    }
    vCopy1->pArray = __s_00;
    vCopy1->nSize = iVar7;
    memset(__s_00,0,(long)iVar7 << 3);
    pAVar8 = p->pAig;
    iVar15 = pAVar8->nRegs;
    if (0 < (long)iVar15) {
      iVar1 = pAVar8->nTruePos;
      lVar17 = (long)iVar1;
      lVar11 = 0;
      do {
        if ((iVar1 < 0) || (pAVar8->vCos->nSize <= lVar17)) goto LAB_008e2d67;
        uVar5 = (ulong)(uint)pAVar8->nTruePis + lVar11;
        iVar12 = (int)uVar5;
        if ((iVar12 < 0) || (pAVar8->vCis->nSize <= iVar12)) goto LAB_008e2d67;
        pvVar13 = pAVar8->vCos->pArray[lVar17];
        if (((ulong)pvVar13 & 1) != 0) goto LAB_008e2da5;
        uVar18 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar18 == 0) {
          pvVar14 = (void *)0x0;
        }
        else {
          pvVar14 = (void *)((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^
                            *(ulong *)(uVar18 + 0x28));
        }
        uVar2 = *(uint *)((long)pAVar8->vCis->pArray[uVar5 & 0xffffffff] + 0x24);
        if (((int)uVar2 < 0) || (iVar16 <= (int)uVar2)) goto LAB_008e2d86;
        __s[uVar2] = pvVar14;
        uVar5 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pvVar13 = (void *)0x0;
        }
        else {
          pvVar13 = (void *)((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^
                            *(ulong *)(uVar5 + 0x28));
        }
        if (iVar7 <= (int)uVar2) goto LAB_008e2d86;
        __s_00[uVar2] = pvVar13;
        lVar11 = lVar11 + 1;
        lVar17 = lVar17 + 1;
      } while (iVar15 != lVar11);
    }
    pAVar8 = p->pAig;
    if (0 < pAVar8->nRegs) {
      iVar15 = 0;
      do {
        uVar2 = pAVar8->nTruePos + iVar15;
        if (((((int)uVar2 < 0) || (pAVar8->vCos->nSize <= (int)uVar2)) ||
            (uVar10 = pAVar8->nTruePis + iVar15, (int)uVar10 < 0)) ||
           (pAVar8->vCis->nSize <= (int)uVar10)) {
LAB_008e2d67:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar4 = (Aig_Obj_t *)pAVar8->vCis->pArray[uVar10];
        iVar1 = pAVar4->Id;
        lVar17 = (long)iVar1;
        if ((lVar17 < 0) || (iVar16 <= iVar1)) {
LAB_008e2d86:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        pvVar13 = pAVar8->vCos->pArray[uVar2];
        __s[lVar17] = (void *)((ulong)p_00->pConst1 ^ 1);
        if (iVar7 <= iVar1) goto LAB_008e2d86;
        __s_00[lVar17] = p_00->pConst1;
        pAVar9 = Cgt_ManConstructCareCondition(p,p_00,pAVar4,pVVar6,vCopy1);
        if (((ulong)pvVar13 & 1) != 0) {
LAB_008e2da5:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar5 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pvVar14 = (void *)0x0;
        }
        else {
          pvVar14 = (void *)((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^
                            *(ulong *)(uVar5 + 0x28));
        }
        uVar2 = pAVar4->Id;
        if (((int)uVar2 < 0) || (iVar16 <= (int)uVar2)) goto LAB_008e2d86;
        __s[uVar2] = pvVar14;
        uVar5 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pvVar14 = (void *)0x0;
        }
        else {
          pvVar14 = (void *)((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^
                            *(ulong *)(uVar5 + 0x28));
        }
        if (iVar7 <= (int)uVar2) goto LAB_008e2d86;
        __s_00[uVar2] = pvVar14;
        uVar5 = *(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar13 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_Exor(p_00,(Aig_Obj_t *)(pAVar4->field_5).pData,p1);
        pAVar4 = Aig_And(p_00,pAVar4,pAVar9);
        pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
        *(Aig_Obj_t **)((long)pvVar13 + 0x28) = pAVar4;
        iVar15 = iVar15 + 1;
        pAVar8 = p->pAig;
      } while (iVar15 < pAVar8->nRegs);
    }
    if (__s != (void **)0x0) {
      free(__s);
      pVVar6->pArray = (void **)0x0;
    }
    free(pVVar6);
    if (__s_00 != (void **)0x0) {
      free(__s_00);
      vCopy1->pArray = (void **)0x0;
    }
    free(vCopy1);
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetCioIds(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Cgt_ManDeriveAigForGating( Cgt_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pCare, * pMiter;
    Vec_Ptr_t * vCopy0, * vCopy1;
    int i;
    assert( Aig_ManRegNum(p->pAig) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p->pAig) );
    pNew->pName = Abc_UtilStrsav( "CG_miter" );
    // build the first frame
    Aig_ManConst1(p->pAig)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p->pAig, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
//    Saig_ManForEachPo( p->pAig, pObj, i )
//        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    if ( p->pPars->nOdcMax > 0 )
    {
        // create storage for observability conditions
        vCopy0 = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
        vCopy1 = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
        // initialize register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
        }
        // compute observability condition for each latch output
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            // set the constants
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ManConst0(pNew) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ManConst1(pNew) );
            // compute condition
            pCare = Cgt_ManConstructCareCondition( p, pNew, pObjLo, vCopy0, vCopy1 );
            // restore the values
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            // compute the miter
            pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
            pMiter = Aig_And( pNew, pMiter, pCare );
            pObjLi->pData = Aig_ObjCreateCo( pNew, pMiter );
        }
        Vec_PtrFree( vCopy0 );
        Vec_PtrFree( vCopy1 );
    }
    else
    {
        // construct clock-gating miters for each register input
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
            pObjLi->pData = Aig_ObjCreateCo( pNew, pMiter );
        }
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetCioIds( pNew );
    return pNew;
}